

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

int run_test(int inprocess)

{
  long lVar1;
  int iVar2;
  uv_handle_type uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar4;
  void *pvVar5;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  uv_write_t *req;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long *plVar9;
  test_ctx *ptVar10;
  uv_handle_t *handle;
  uv_pipe_t *puVar11;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_thread_t tid;
  uv_process_t process;
  undefined1 auStack_158 [64];
  char acStack_a0 [8];
  uv_buf_t uStack_98;
  long local_88;
  long local_80;
  uv_thread_t local_78;
  uv_process_t local_70;
  
  auStack_158._48_8_ = auStack_158._40_8_;
  plVar9 = &local_88;
  if (inprocess == 0) {
    uStack_98.len = 0x1a5222;
    spawn_helper(&ctx.channel,&local_70,"ipc_send_recv_helper");
    uStack_98.len = 0x1a5230;
    connect_cb(&ctx.connect_req,0);
LAB_001a5230:
    uStack_98.len = 0x1a5235;
    puVar4 = uv_default_loop();
    uStack_98.len = 0x1a523f;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    local_88 = (long)iVar2;
    local_80 = 0;
    if (local_88 != 0) {
      uStack_98.len = 0x1a52b6;
      run_test_cold_3();
LAB_001a52b6:
      uStack_98.len = 0x1a52c3;
      run_test_cold_4();
LAB_001a52c3:
      uStack_98.len = 0x1a52d0;
      run_test_cold_1();
      goto LAB_001a52d0;
    }
    local_88 = 2;
    local_80 = (long)recv_cb_count;
    if (local_80 != 2) goto LAB_001a52b6;
    if (inprocess == 0) {
      return 2;
    }
    uStack_98.len = 0x1a5286;
    iVar2 = uv_thread_join(&local_78);
    local_88 = (long)iVar2;
    local_80 = 0;
    if (local_88 == 0) {
      return iVar2;
    }
  }
  else {
    uStack_98.len = 0x1a5188;
    iVar2 = uv_thread_create(&local_78,ipc_send_recv_helper_threadproc,(void *)0x2a);
    local_70.data = (void *)(long)iVar2;
    local_88 = 0;
    if (local_70.data != (void *)0x0) goto LAB_001a52c3;
    uStack_98.len = 0x1a51b0;
    uv_sleep(1000);
    uStack_98.len = 0x1a51b5;
    puVar4 = uv_default_loop();
    uStack_98.len = 0x1a51c9;
    iVar2 = uv_pipe_init(puVar4,&ctx.channel,1);
    local_70.data = (void *)(long)iVar2;
    local_88 = 0;
    if (local_70.data == (void *)0x0) {
      uStack_98.len = 0x1a5208;
      uv_pipe_connect(&ctx.connect_req,&ctx.channel,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_001a5230;
    }
LAB_001a52d0:
    uStack_98.len = 0x1a52dd;
    run_test_cold_2();
  }
  iVar2 = (int)&local_80;
  uStack_98.len = (size_t)connect_cb;
  run_test_cold_5();
  if ((uv_connect_t *)plVar9 == &ctx.connect_req) {
    uStack_98.base = (char *)(long)iVar2;
    if ((char *)(long)iVar2 != (char *)0x0) goto LAB_001a541f;
    uStack_98 = uv_buf_init(".",1);
    iVar2 = uv_write2(&ctx.write_req,(uv_stream_t *)&ctx,&uStack_98,1,&ctx.send.stream,
                      (uv_write_cb)0x0);
    acStack_a0[0] = '\0';
    acStack_a0[1] = '\0';
    acStack_a0[2] = '\0';
    acStack_a0[3] = '\0';
    acStack_a0[4] = '\0';
    acStack_a0[5] = '\0';
    acStack_a0[6] = '\0';
    acStack_a0[7] = '\0';
    if (iVar2 != 0) goto LAB_001a542e;
    uStack_98 = uv_buf_init(".",1);
    iVar2 = uv_write2(&ctx.write_req2,(uv_stream_t *)&ctx,&uStack_98,1,&ctx.send2.stream,
                      (uv_write_cb)0x0);
    acStack_a0[0] = '\0';
    acStack_a0[1] = '\0';
    acStack_a0[2] = '\0';
    acStack_a0[3] = '\0';
    acStack_a0[4] = '\0';
    acStack_a0[5] = '\0';
    acStack_a0[6] = '\0';
    acStack_a0[7] = '\0';
    if (iVar2 != 0) goto LAB_001a543d;
    iVar2 = uv_read_start((uv_stream_t *)&ctx,alloc_cb,recv_cb);
    acStack_a0[0] = '\0';
    acStack_a0[1] = '\0';
    acStack_a0[2] = '\0';
    acStack_a0[3] = '\0';
    acStack_a0[4] = '\0';
    acStack_a0[5] = '\0';
    acStack_a0[6] = '\0';
    acStack_a0[7] = '\0';
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    connect_cb_cold_1();
LAB_001a541f:
    connect_cb_cold_2();
LAB_001a542e:
    connect_cb_cold_3();
LAB_001a543d:
    connect_cb_cold_4();
  }
  pcVar6 = acStack_a0;
  connect_cb_cold_5();
  extraout_RDX[1] = 8;
  ptVar10 = (test_ctx *)0x8;
  pvVar5 = malloc(8);
  *extraout_RDX = pvVar5;
  if (pvVar5 != (void *)0x0) {
    return (int)pvVar5;
  }
  alloc_cb_cold_1();
  pcVar7 = pcVar6;
  free((void *)*extraout_RDX_00);
  if (ptVar10 == &ctx) {
    while( true ) {
      lVar1 = (long)recv_cb_count + 1;
      puVar11 = (uv_pipe_t *)&ctx.recv2;
      if ((long)recv_cb_count == 0) {
        puVar11 = (uv_pipe_t *)&ctx.recv;
      }
      recv_cb_count = (int)lVar1;
      if (pcVar6 != (char *)0xfffffffffffff001) break;
      if (lVar1 != 2) {
        recv_cb_cold_7();
LAB_001a5631:
        recv_cb_cold_5();
LAB_001a563e:
        recv_cb_cold_2();
LAB_001a564b:
        recv_cb_cold_6();
LAB_001a5658:
        recv_cb_cold_4();
        goto LAB_001a5665;
      }
LAB_001a55e2:
      iVar2 = uv_pipe_pending_count(&ctx.channel);
      if (iVar2 < 1) {
        if (recv_cb_count == 2) {
          uv_close((uv_handle_t *)&ctx,(uv_close_cb)0x0);
          return extraout_EAX;
        }
        return iVar2;
      }
    }
    if ((long)pcVar6 < 0) goto LAB_001a564b;
    iVar2 = uv_pipe_pending_count(&ctx.channel);
    if (iVar2 < 1) goto LAB_001a563e;
    uVar3 = uv_pipe_pending_type(&ctx.channel);
    if (uVar3 == ctx.expected_type) {
      if (uVar3 == UV_TCP) {
        iVar2 = uv_tcp_init(ctx.channel.loop,(uv_tcp_t *)puVar11);
      }
      else {
        if (uVar3 != UV_NAMED_PIPE) goto LAB_001a5672;
        iVar2 = uv_pipe_init(ctx.channel.loop,puVar11,0);
      }
      if (iVar2 == 0) {
        iVar2 = uv_accept((uv_stream_t *)&ctx,(uv_stream_t *)puVar11);
        if (iVar2 != 0) goto LAB_001a5631;
        goto LAB_001a55e2;
      }
      goto LAB_001a5658;
    }
LAB_001a5665:
    recv_cb_cold_3();
LAB_001a5672:
    abort();
  }
  recv_cb_cold_1();
  auStack_158._8_8_ = (uv_loop_t *)0x1a569b;
  pcVar8 = pcVar7;
  auStack_158._56_8_ = pcVar6;
  free((void *)*extraout_RDX_01);
  iVar2 = (int)pcVar8;
  if ((pcVar7 == (char *)0xfffffffffffff001) || (pcVar7 == (char *)0xffffffffffffff99)) {
    return extraout_EAX_00;
  }
  auStack_158._40_8_ = pcVar7;
  auStack_158._24_8_ = (uv_close_cb)0x0;
  if (-1 < (long)pcVar7) {
    if (ptVar10 != (test_ctx *)&ctx2.channel) goto LAB_001a586e;
    auStack_158._8_8_ = (uv_loop_t *)0x1a56ec;
    iVar2 = uv_pipe_pending_count(&ctx2.channel);
    if (iVar2 < 1) {
      return iVar2;
    }
    ptVar10 = (test_ctx *)&ctx2.channel;
    while( true ) {
      read_cb_count = read_cb_count + 1;
      req = &ctx2.write_req2;
      if (read_cb_count == 2) {
        req = &ctx2.write_req;
      }
      puVar11 = (uv_pipe_t *)&ctx2.recv2;
      if (read_cb_count == 2) {
        puVar11 = (uv_pipe_t *)&ctx2.recv;
      }
      auStack_158._8_8_ = (uv_loop_t *)0x1a574b;
      uVar3 = uv_pipe_pending_type(&ctx2.channel);
      if (uVar3 != UV_NAMED_PIPE) break;
      auStack_158._8_8_ = (uv_loop_t *)0x1a577b;
      iVar2 = uv_pipe_init(ctx2.channel.loop,puVar11,0);
LAB_001a577b:
      auStack_158._24_8_ = SEXT48(iVar2);
      auStack_158._32_8_ = (uv__queue *)0x0;
      if ((uv_close_cb)auStack_158._24_8_ != (uv_close_cb)0x0) {
LAB_001a584b:
        auStack_158._8_8_ = (uv_loop_t *)0x1a585a;
        read_cb_cold_2();
        goto LAB_001a585a;
      }
      auStack_158._8_8_ = (uv_loop_t *)0x1a57a6;
      iVar2 = uv_accept((uv_stream_t *)&ctx2.channel,(uv_stream_t *)puVar11);
      auStack_158._24_8_ = SEXT48(iVar2);
      auStack_158._32_8_ = (uv__queue *)0x0;
      if ((uv_close_cb)auStack_158._24_8_ != (uv_close_cb)0x0) {
LAB_001a583c:
        auStack_158._8_8_ = (uv_loop_t *)0x1a584b;
        read_cb_cold_3();
        goto LAB_001a584b;
      }
      auStack_158._8_8_ = (uv_loop_t *)0x1a57cf;
      auStack_158._40_16_ = (undefined1  [16])uv_buf_init(".",1);
      auStack_158._8_8_ = (uv_loop_t *)0x1a57f2;
      iVar2 = uv_write2(req,(uv_stream_t *)&ctx2.channel,(uv_buf_t *)(auStack_158 + 0x28),1,
                        (uv_stream_t *)puVar11,write2_cb);
      auStack_158._24_8_ = SEXT48(iVar2);
      auStack_158._32_8_ = (uv__queue *)0x0;
      if ((uv_close_cb)auStack_158._24_8_ != (uv_close_cb)0x0) {
        auStack_158._8_8_ = (uv_loop_t *)0x1a583c;
        read_cb_cold_4();
        goto LAB_001a583c;
      }
      auStack_158._8_8_ = (uv_loop_t *)0x1a5816;
      iVar2 = uv_pipe_pending_count(&ctx2.channel);
      if (iVar2 < 1) {
        return iVar2;
      }
    }
    if (uVar3 == UV_TCP) {
      auStack_158._8_8_ = (uv_loop_t *)0x1a5768;
      iVar2 = uv_tcp_init(ctx2.channel.loop,(uv_tcp_t *)puVar11);
      goto LAB_001a577b;
    }
LAB_001a585a:
    auStack_158._8_8_ = (uv_loop_t *)0x1a585f;
    read_cb_cold_5();
  }
  iVar2 = (int)auStack_158 + 0x18;
  auStack_158._8_8_ = (uv_loop_t *)0x1a586e;
  read_cb_cold_6();
LAB_001a586e:
  auStack_158._8_8_ = write2_cb;
  read_cb_cold_1();
  auStack_158._0_8_ = SEXT48(iVar2);
  auStack_158._8_8_ = ptVar10;
  if ((void *)auStack_158._0_8_ != (void *)0x0) {
    handle = (uv_handle_t *)auStack_158;
    write2_cb_cold_1();
    iVar2 = uv_is_closing(handle);
    if (iVar2 != 0) {
      return iVar2;
    }
    uv_close(handle,(uv_close_cb)0x0);
    return extraout_EAX_02;
  }
  write2_cb_called = write2_cb_called + 1;
  if ((write2_cb_called == 2) && (is_in_process != 0)) {
    uv_close(&ctx2.recv.handle,(uv_close_cb)0x0);
    uv_close(&ctx2.recv2.handle,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&ctx2.channel,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&ctx2,(uv_close_cb)0x0);
    return extraout_EAX_01;
  }
  return write2_cb_called;
}

Assistant:

int run_test(const char* test,
             int benchmark_output,
             int test_count) {
  char errmsg[1024] = "";
  process_info_t processes[1024];
  process_info_t *main_proc;
  task_entry_t* task;
  int timeout_multiplier;
  int process_count;
  int result;
  int status;
  int i;

  status = 255;
  main_proc = NULL;
  process_count = 0;

#ifndef _WIN32
  /* Clean up stale socket from previous run. */
  remove(TEST_PIPENAME);
  remove(TEST_PIPENAME_2);
  remove(TEST_PIPENAME_3);
#endif

  /* If it's a helper the user asks for, start it directly. */
  for (task = TASKS; task->main; task++) {
    if (task->is_helper && strcmp(test, task->process_name) == 0) {
      return task->main();
    }
  }

  /* Start the helpers first. */
  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) != 0) {
      continue;
    }

    /* Skip the test itself. */
    if (!task->is_helper) {
      continue;
    }

    if (process_start(task->task_name,
                      task->process_name,
                      &processes[process_count],
                      1 /* is_helper */) == -1) {
      snprintf(errmsg,
               sizeof errmsg,
               "Process `%s` failed to start.",
               task->process_name);
      goto out;
    }

    process_count++;
  }

  /* Now start the test itself. */
  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) != 0) {
      continue;
    }

    if (task->is_helper) {
      continue;
    }

    if (process_start(task->task_name,
                      task->process_name,
                      &processes[process_count],
                      0 /* !is_helper */) == -1) {
      snprintf(errmsg,
               sizeof errmsg,
               "Process `%s` failed to start.",
               task->process_name);
      goto out;
    }

    main_proc = &processes[process_count];
    process_count++;
    break;
  }

  if (main_proc == NULL) {
    snprintf(errmsg,
             sizeof errmsg,
             "No test with that name: %s",
             test);
    goto out;
  }

  timeout_multiplier = 1;
#ifndef _WIN32
  do {
    const char* var;

    var = getenv("UV_TEST_TIMEOUT_MULTIPLIER");
    if (var == NULL)
      break;

    timeout_multiplier = atoi(var);
    if (timeout_multiplier <= 0)
      timeout_multiplier = 1;
  } while (0);
#endif

  result = process_wait(main_proc, 1, task->timeout * timeout_multiplier);
  if (result == -1) {
    FATAL("process_wait failed");
  } else if (result == -2) {
    /* Don't have to clean up the process, process_wait() has killed it. */
    snprintf(errmsg,
             sizeof errmsg,
             "timeout");
    goto out;
  }

  status = process_reap(main_proc);
  if (status != TEST_OK) {
    snprintf(errmsg,
             sizeof errmsg,
             "exit code %d",
             status);
    goto out;
  }

  if (benchmark_output) {
    /* Give the helpers time to clean up their act. */
    uv_sleep(1000);
  }

out:
  /* Reap running processes except the main process, it's already dead. */
  for (i = 0; i < process_count - 1; i++) {
    process_terminate(&processes[i]);
  }

  if (process_count > 0 &&
      process_wait(processes, process_count - 1, -1) < 0) {
    FATAL("process_wait failed");
  }

  log_tap_result(test_count, test, status, &processes[i]);

  /* Show error and output from processes if the test failed. */
  if ((status != TEST_OK && status != TEST_SKIP) || task->show_output) {
    if (strlen(errmsg) > 0)
      fprintf(stdout, "# %s\n", errmsg);
    fprintf(stdout, "# ");
    fflush(stdout);

    for (i = 0; i < process_count; i++) {
      switch (process_output_size(&processes[i])) {
       case -1:
        fprintf(stdout, "Output from process `%s`: (unavailable)\n",
                process_get_name(&processes[i]));
        fflush(stdout);
        break;

       case 0:
        fprintf(stdout, "Output from process `%s`: (no output)\n",
                process_get_name(&processes[i]));
        fflush(stdout);
        break;

       default:
        fprintf(stdout, "Output from process `%s`:\n", process_get_name(&processes[i]));
        fflush(stdout);
        process_copy_output(&processes[i], stdout);
        break;
      }
    }

  /* In benchmark mode show concise output from the main process. */
  } else if (benchmark_output) {
    switch (process_output_size(main_proc)) {
     case -1:
      fprintf(stdout, "%s: (unavailable)\n", test);
      fflush(stdout);
      break;

     case 0:
      fprintf(stdout, "%s: (no output)\n", test);
      fflush(stdout);
      break;

     default:
      for (i = 0; i < process_count; i++) {
        process_copy_output(&processes[i], stdout);
      }
      break;
    }
  }

  /* Clean up all process handles. */
  for (i = 0; i < process_count; i++) {
    process_cleanup(&processes[i]);
  }

  return status;
}